

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

uint32_t chacha_next32(mi_random_ctx_t *ctx)

{
  uint32_t uVar1;
  long lVar2;
  
  if (ctx->output_available < 1) {
    chacha_block(ctx);
    ctx->output_available = 0x10;
  }
  lVar2 = 0x10 - (long)ctx->output_available;
  uVar1 = *(uint32_t *)((long)ctx + lVar2 * 4 + 0x40);
  *(undefined4 *)((long)ctx + lVar2 * 4 + 0x40) = 0;
  ctx->output_available = ctx->output_available + -1;
  return uVar1;
}

Assistant:

static uint32_t chacha_next32(mi_random_ctx_t* ctx) {
  if (ctx->output_available <= 0) {
    chacha_block(ctx);
    ctx->output_available = 16; // (assign again to suppress static analysis warning)
  }
  const uint32_t x = ctx->output[16 - ctx->output_available];
  ctx->output[16 - ctx->output_available] = 0; // reset once the data is handed out
  ctx->output_available--;
  return x;
}